

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisManager.cpp
# Opt level: O2

void __thiscall
slang::analysis::AnalysisManager::analyzeScopeAsync(AnalysisManager *this,Scope *scope)

{
  atomic<unsigned_long> *paVar1;
  mutex *__mutex;
  conditional_t<priority_enabled,_std::priority_queue<pr_task>,_std::queue<task_t>_> *this_00;
  group_type_pointer pgVar2;
  insert_counter_type *piVar3;
  __int_type _Var4;
  __int_type_conflict1 _Var5;
  __int_type _Var6;
  group_type_pointer pgVar7;
  value_type_pointer ppVar8;
  ulong uVar9;
  _Map_pointer ppfVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  ushort uVar13;
  __int_type_conflict _Var14;
  __int_type_conflict _Var15;
  __int_type_conflict _Var16;
  __int_type_conflict _Var17;
  bool bVar18;
  bool bVar19;
  uint uVar20;
  size_type sVar21;
  _Ptr pfVar22;
  _Elt_pointer pfVar23;
  ulong uVar24;
  group_access_pointer pgVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  __int_type_conflict local_98;
  long local_90;
  int *local_40;
  char local_38;
  
  auVar12._8_8_ = 0;
  auVar12._0_8_ = scope;
  uVar24 = SUB168(auVar12 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar12 * ZEXT816(0x9e3779b97f4a7c15),0);
LAB_003271b4:
  boost::unordered::detail::foa::
  concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  ::shared_access((concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                   *)&stack0xffffffffffffffc0);
  uVar26 = uVar24 >> ((byte)(this->analyzedScopes).table_.
                            super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                            .arrays.
                            super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                            .groups_size_index & 0x3f);
  lVar28 = (uVar24 & 0xff) * 4;
  _Var14 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>::
           match_word(unsigned_long)::word[lVar28 + 0xc];
  _Var15 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>::
           match_word(unsigned_long)::word[lVar28 + 0xd];
  _Var16 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>::
           match_word(unsigned_long)::word[lVar28 + 0xe];
  _Var17 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>::
           match_word(unsigned_long)::word[lVar28 + 0xf];
  do {
    _Var6 = (this->analyzedScopes).table_.
            super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
            .arrays.group_accesses_[uVar26].cnt.super___atomic_base<unsigned_int>._M_i;
    uVar27 = 0;
    uVar29 = uVar26;
    do {
      pgVar7 = (this->analyzedScopes).table_.
               super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
               .arrays.
               super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
               .groups_;
      pgVar2 = pgVar7 + uVar29;
      auVar30[0] = -(pgVar2->m[0].n.super___atomic_base<unsigned_char>._M_i == _Var14);
      auVar30[1] = -(pgVar2->m[1].n.super___atomic_base<unsigned_char>._M_i == _Var15);
      auVar30[2] = -(pgVar2->m[2].n.super___atomic_base<unsigned_char>._M_i == _Var16);
      auVar30[3] = -(pgVar2->m[3].n.super___atomic_base<unsigned_char>._M_i == _Var17);
      auVar30[4] = -(pgVar2->m[4].n.super___atomic_base<unsigned_char>._M_i == _Var14);
      auVar30[5] = -(pgVar2->m[5].n.super___atomic_base<unsigned_char>._M_i == _Var15);
      auVar30[6] = -(pgVar2->m[6].n.super___atomic_base<unsigned_char>._M_i == _Var16);
      auVar30[7] = -(pgVar2->m[7].n.super___atomic_base<unsigned_char>._M_i == _Var17);
      auVar30[8] = -(pgVar2->m[8].n.super___atomic_base<unsigned_char>._M_i == _Var14);
      auVar30[9] = -(pgVar2->m[9].n.super___atomic_base<unsigned_char>._M_i == _Var15);
      auVar30[10] = -(pgVar2->m[10].n.super___atomic_base<unsigned_char>._M_i == _Var16);
      auVar30[0xb] = -(pgVar2->m[0xb].n.super___atomic_base<unsigned_char>._M_i == _Var17);
      auVar30[0xc] = -(pgVar2->m[0xc].n.super___atomic_base<unsigned_char>._M_i == _Var14);
      auVar30[0xd] = -(pgVar2->m[0xd].n.super___atomic_base<unsigned_char>._M_i == _Var15);
      auVar30[0xe] = -(pgVar2->m[0xe].n.super___atomic_base<unsigned_char>._M_i == _Var16);
      auVar30[0xf] = -(pgVar2->m[0xf].n.super___atomic_base<unsigned_char>._M_i == _Var17);
      uVar20 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe);
      if (uVar20 != 0) {
        ppVar8 = (this->analyzedScopes).table_.
                 super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                 .arrays.
                 super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                 .elements_;
        pgVar25 = (this->analyzedScopes).table_.
                  super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                  .arrays.group_accesses_ + uVar29;
        boost::unordered::detail::foa::rw_spinlock::lock_shared(&pgVar25->m);
        do {
          uVar11 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
            }
          }
          if ((pgVar7[uVar29].m[uVar11].n.super___atomic_base<unsigned_char>._M_i != '\0') &&
             (ppVar8[uVar29 * 0xf + (ulong)uVar11].first == scope)) {
            LOCK();
            (pgVar25->m).state_.super___atomic_base<unsigned_int>._M_i =
                 (pgVar25->m).state_.super___atomic_base<unsigned_int>._M_i - 1;
            UNLOCK();
            bVar19 = true;
            goto LAB_00327399;
          }
          uVar20 = uVar20 - 1 & uVar20;
        } while (uVar20 != 0);
        LOCK();
        (pgVar25->m).state_.super___atomic_base<unsigned_int>._M_i =
             (pgVar25->m).state_.super___atomic_base<unsigned_int>._M_i - 1;
        UNLOCK();
      }
      local_90 = 1;
      if ((*(byte *)((long)&boost::unordered::detail::foa::
                            group15<boost::unordered::detail::foa::atomic_integral>::
                            is_not_overflowed(unsigned_long)::shift + (ulong)((uint)uVar24 & 7)) &
          pgVar7[uVar29].m[0xf].n.super___atomic_base<unsigned_char>._M_i) == 0) break;
      uVar9 = (this->analyzedScopes).table_.
              super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
              .arrays.
              super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
              .groups_size_mask;
      lVar28 = uVar29 + uVar27;
      uVar27 = uVar27 + 1;
      uVar29 = lVar28 + 1U & uVar9;
    } while (uVar27 <= uVar9);
    LOCK();
    paVar1 = &(this->analyzedScopes).table_.
              super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
              .size_ctrl.size;
    _Var5 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    uVar29 = uVar26;
    if ((this->analyzedScopes).table_.
        super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
        .size_ctrl.ml.super___atomic_base<unsigned_long>._M_i < _Var5 + 1) {
      LOCK();
      paVar1 = &(this->analyzedScopes).table_.
                super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                .size_ctrl.size;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
      UNLOCK();
      bVar18 = true;
      bVar19 = false;
      goto LAB_0032739c;
    }
    while( true ) {
      pgVar7 = (this->analyzedScopes).table_.
               super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
               .arrays.
               super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
               .groups_;
      pgVar25 = (this->analyzedScopes).table_.
                super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                .arrays.group_accesses_ + uVar29;
      boost::unordered::detail::foa::rw_spinlock::lock(&pgVar25->m);
      pgVar2 = pgVar7 + uVar29;
      auVar31[0] = -(pgVar2->m[0].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar31[1] = -(pgVar2->m[1].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar31[2] = -(pgVar2->m[2].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar31[3] = -(pgVar2->m[3].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar31[4] = -(pgVar2->m[4].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar31[5] = -(pgVar2->m[5].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar31[6] = -(pgVar2->m[6].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar31[7] = -(pgVar2->m[7].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar31[8] = -(pgVar2->m[8].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar31[9] = -(pgVar2->m[9].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar31[10] = -(pgVar2->m[10].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar31[0xb] = -(pgVar2->m[0xb].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar31[0xc] = -(pgVar2->m[0xc].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar31[0xd] = -(pgVar2->m[0xd].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar31[0xe] = -(pgVar2->m[0xe].n.super___atomic_base<unsigned_char>._M_i == '\0');
      auVar31[0xf] = -(pgVar2->m[0xf].n.super___atomic_base<unsigned_char>._M_i == '\0');
      uVar13 = (ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe;
      if (uVar13 != 0) break;
      LOCK();
      pgVar7[uVar29].m[0xf].n.super___atomic_base<unsigned_char>._M_i =
           pgVar7[uVar29].m[0xf].n.super___atomic_base<unsigned_char>._M_i |
           '\x01' << ((byte)uVar24 & 7);
      UNLOCK();
      (pgVar25->m).state_.super___atomic_base<unsigned_int>._M_i = 0;
      uVar29 = uVar29 + local_90;
      local_90 = local_90 + 1;
      uVar29 = uVar29 & (this->analyzedScopes).table_.
                        super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                        .arrays.
                        super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                        .groups_size_mask;
    }
    uVar20 = 0;
    if (uVar13 != 0) {
      for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
      }
    }
    uVar27 = (ulong)uVar20;
    pgVar7[uVar29].m[uVar27].n.super___atomic_base<unsigned_char>._M_i = local_98;
    LOCK();
    piVar3 = &(this->analyzedScopes).table_.
              super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
              .arrays.group_accesses_[uVar26].cnt;
    _Var4 = (piVar3->super___atomic_base<unsigned_int>)._M_i;
    (piVar3->super___atomic_base<unsigned_int>)._M_i =
         (piVar3->super___atomic_base<unsigned_int>)._M_i + 1;
    UNLOCK();
    if (_Var4 == _Var6) break;
    pgVar7[uVar29].m[uVar27].n.super___atomic_base<unsigned_char>._M_i = '\0';
    (pgVar25->m).state_.super___atomic_base<unsigned_int>._M_i = 0;
    LOCK();
    paVar1 = &(this->analyzedScopes).table_.
              super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
              .size_ctrl.size;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
    UNLOCK();
  } while( true );
  ppVar8 = (this->analyzedScopes).table_.
           super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
           .arrays.
           super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
           .elements_;
  ppVar8[uVar29 * 0xf + uVar27].first = scope;
  ppVar8[uVar29 * 0xf + uVar27].second.
  super__Optional_base<const_slang::analysis::AnalyzedScope_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_slang::analysis::AnalyzedScope_*>._M_engaged = false;
  (pgVar25->m).state_.super___atomic_base<unsigned_int>._M_i = 0;
  bVar19 = false;
LAB_00327399:
  bVar18 = false;
LAB_0032739c:
  if (local_38 == '\x01') {
    LOCK();
    *local_40 = *local_40 + -1;
    UNLOCK();
  }
  if (!bVar18) {
    if (!bVar19) {
      __mutex = &(this->threadPool).tasks_mutex;
      std::mutex::lock(__mutex);
      pfVar23 = (this->threadPool).tasks.c.
                super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pfVar23 ==
          *(_Elt_pointer *)
           ((long)&(this->threadPool).tasks.c.
                   super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish + 0x10) + -1) {
        this_00 = &(this->threadPool).tasks;
        sVar21 = std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::size
                           (&this_00->c);
        if (sVar21 == 0x7ffffffffffffff) {
          std::__throw_length_error("cannot create std::deque larger than max_size()");
        }
        std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
        _M_reserve_map_at_back(&this_00->c,1);
        pfVar22 = std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                  ::_M_allocate_node((_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                      *)this_00);
        (*(_Map_pointer *)
          ((long)&(this->threadPool).tasks.c.
                  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish + 0x18))[1] = pfVar22;
        pfVar23 = (this->threadPool).tasks.c.
                  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        *(AnalysisManager **)&(pfVar23->super__Function_base)._M_functor = this;
        *(Scope **)((long)&(pfVar23->super__Function_base)._M_functor + 8) = scope;
        pfVar23->_M_invoker =
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/analysis/AnalysisManager.cpp:149:32)>
             ::_M_invoke;
        (pfVar23->super__Function_base)._M_manager =
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/analysis/AnalysisManager.cpp:149:32)>
             ::_M_manager;
        ppfVar10 = *(_Map_pointer *)
                    ((long)&(this->threadPool).tasks.c.
                            super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish + 0x18);
        *(_Map_pointer *)
         ((long)&(this->threadPool).tasks.c.
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish + 0x18) = ppfVar10 + 1;
        pfVar23 = ppfVar10[1];
        *(_Elt_pointer *)
         ((long)&(this->threadPool).tasks.c.
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish + 8) = pfVar23;
        *(_Elt_pointer *)
         ((long)&(this->threadPool).tasks.c.
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish + 0x10) = pfVar23 + 0x10;
      }
      else {
        *(AnalysisManager **)&(pfVar23->super__Function_base)._M_functor = this;
        *(Scope **)((long)&(pfVar23->super__Function_base)._M_functor + 8) = scope;
        pfVar23->_M_invoker =
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/analysis/AnalysisManager.cpp:149:32)>
             ::_M_invoke;
        (pfVar23->super__Function_base)._M_manager =
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/analysis/AnalysisManager.cpp:149:32)>
             ::_M_manager;
        pfVar23 = (this->threadPool).tasks.c.
                  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      (this->threadPool).tasks.c.
      super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur = pfVar23;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      std::_V2::condition_variable_any::notify_one(&(this->threadPool).task_available_cv);
    }
    return;
  }
  boost::unordered::detail::foa::
  concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  ::rehash_if_full(&(this->analyzedScopes).table_);
  goto LAB_003271b4;
}

Assistant:

void AnalysisManager::analyzeScopeAsync(const Scope& scope) {
    // Kick off a new analysis task if we haven't already seen
    // this scope before.
    if (analyzedScopes.try_emplace(&scope, std::nullopt)) {
        threadPool.detach_task([this, &scope] {
            SLANG_TRY {
                auto& result = analyzeScopeBlocking(scope);
                analyzedScopes.visit(&scope, [&result](auto& item) { item.second = &result; });
            }
            SLANG_CATCH(...) {
                std::unique_lock<std::mutex> lock(mutex);
                pendingException = std::current_exception();
            }
        });
    }